

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::free
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this,void *__ptr)

{
  bool bVar1;
  __pointer_type pTVar2;
  atomic<depspawn::internal::TaskPool::Task_*> *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffe0;
  memory_order __m;
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *__p1;
  
  __m = (memory_order)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  __p1 = this;
  depspawn::internal::TaskPool::Task::~Task((Task *)0x12a942);
  pTVar2 = std::atomic<depspawn::internal::TaskPool::Task_*>::load
                     ((atomic<depspawn::internal::TaskPool::Task_*> *)this,__m);
  ((Task *)__ptr)->next = pTVar2;
  do {
    next_ptr((Task *)__ptr,((Task *)__ptr)->next);
    bVar1 = std::atomic<depspawn::internal::TaskPool::Task_*>::compare_exchange_weak
                      (unaff_retaddr,(__pointer_type *)__p1,(__pointer_type)__ptr,
                       (memory_order)((ulong)this >> 0x20));
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void free(T* const datain) noexcept(ALLOC_ONCE)
  {
    if (!ALLOC_ONCE) {
      datain->~T();
    }

    datain->next = head_.load(std::memory_order_relaxed);
    while(!head_.compare_exchange_weak(datain->next, next_ptr(datain, datain->next)));
  }